

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WritePropertyWithDefault<duckdb::optional_idx>
          (Serializer *this,field_id_t field_id,char *tag,optional_idx *value,
          optional_idx *default_value)

{
  bool bVar1;
  optional_idx in_RCX;
  undefined8 in_RDX;
  undefined2 in_SI;
  long *in_RDI;
  Serializer *in_R8;
  
  if (((*(byte *)((long)in_RDI + 9) & 1) == 0) &&
     (bVar1 = optional_idx::operator==((optional_idx *)in_RCX.index,(optional_idx *)in_R8), bVar1))
  {
    (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,0);
    (**(code **)(*in_RDI + 0x28))(in_RDI,0);
  }
  else {
    (**(code **)(*in_RDI + 0x20))(in_RDI,in_SI,in_RDX,1);
    WriteValue(in_R8,in_RCX);
    (**(code **)(*in_RDI + 0x28))(in_RDI,1);
  }
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}